

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw1_subh1_w4_avx2
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m256i *round_offset,int shift,__m256i *clip_low,__m256i *clip_high,
               __m256i *mask_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong *in_stack_00000008;
  undefined4 in_stack_00000024;
  __m256i adjacent;
  __m256i addrows;
  __m256i m1357;
  __m256i m0246;
  __m256i two_w;
  __m256i one_b;
  undefined4 in_stack_fffffffffffffc74;
  __m256i *in_stack_fffffffffffffc90;
  undefined8 uStack_330;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 auVar18 [16];
  undefined8 uStack_128;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auVar1 = vpinsrb_avx(auVar1,1,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar2 = vpinsrb_avx(auVar2,1,2);
  auVar2 = vpinsrb_avx(auVar2,1,3);
  auVar2 = vpinsrb_avx(auVar2,1,4);
  auVar2 = vpinsrb_avx(auVar2,1,5);
  auVar2 = vpinsrb_avx(auVar2,1,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,1,8);
  auVar2 = vpinsrb_avx(auVar2,1,9);
  auVar2 = vpinsrb_avx(auVar2,1,10);
  auVar2 = vpinsrb_avx(auVar2,1,0xb);
  auVar2 = vpinsrb_avx(auVar2,1,0xc);
  auVar2 = vpinsrb_avx(auVar2,1,0xd);
  auVar2 = vpinsrb_avx(auVar2,1,0xe);
  auVar2 = vpinsrb_avx(auVar2,1,0xf);
  uStack_128 = auVar2._8_8_;
  auVar3 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar3 = vpinsrw_avx(auVar3,2,2);
  auVar3 = vpinsrw_avx(auVar3,2,3);
  auVar3 = vpinsrw_avx(auVar3,2,4);
  auVar3 = vpinsrw_avx(auVar3,2,5);
  auVar3 = vpinsrw_avx(auVar3,2,6);
  auVar3 = vpinsrw_avx(auVar3,2,7);
  auVar4 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar4 = vpinsrw_avx(auVar4,2,2);
  auVar4 = vpinsrw_avx(auVar4,2,3);
  auVar4 = vpinsrw_avx(auVar4,2,4);
  auVar4 = vpinsrw_avx(auVar4,2,5);
  auVar4 = vpinsrw_avx(auVar4,2,6);
  auVar4 = vpinsrw_avx(auVar4,2,7);
  auVar12 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar18 = auVar1;
  do {
    uStack_2a8 = auVar12._8_8_;
    uStack_2b0 = auVar12._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *in_stack_00000008;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask * 2));
    auVar9 = vpunpcklqdq_avx(auVar9,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask << 2));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask * 6));
    auVar10 = vpunpcklqdq_avx(auVar14,auVar16);
    uStack_70 = auVar10._0_8_;
    uStack_68 = auVar10._8_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask * 5));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask * 7));
    auVar10 = vpunpcklqdq_avx(auVar10,auVar15);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)((long)in_stack_00000008 + ((ulong)mask & 0xffffffff));
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask * 3));
    auVar11 = vpunpcklqdq_avx(auVar11,auVar17);
    auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
    uStack_b0 = auVar13._0_8_;
    uStack_a8 = auVar13._8_8_;
    auVar6._16_8_ = uStack_70;
    auVar6._0_16_ = auVar9;
    auVar6._24_8_ = uStack_68;
    auVar5._16_8_ = uStack_b0;
    auVar5._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar11;
    auVar5._24_8_ = uStack_a8;
    auVar5 = vpaddusb_avx2(auVar6,auVar5);
    auVar7._16_8_ = auVar2._0_8_;
    auVar7._0_16_ = auVar1;
    auVar7._24_8_ = uStack_128;
    auVar6 = vpmaddubsw_avx2(auVar5,auVar7);
    uStack_330 = auVar6._16_8_;
    auVar8._16_8_ = uStack_2b0;
    auVar8._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
    auVar8._24_8_ = uStack_2a8;
    auVar5 = vpaddw_avx2(auVar6,auVar8);
    vpsrlw_avx2(auVar5,ZEXT416(2));
    highbd_blend_a64_d16_mask_w4_avx2
              (auVar2._0_8_,auVar18._12_4_,auVar18._0_8_,auVar6._28_4_,uStack_330,auVar6._12_4_,
               (__m256i *)CONCAT44(in_stack_00000024,h),
               (__m256i *)CONCAT44(in_stack_fffffffffffffc74,round_offset._0_4_),shift,clip_low,
               clip_high,in_stack_fffffffffffffc90);
    in_stack_00000008 = (ulong *)((long)in_stack_00000008 + (ulong)(uint)((int)mask << 3));
    mask_stride = mask_stride - 4;
  } while (mask_stride != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw1_subh1_w4_avx2(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m256i *round_offset, int shift, const __m256i *clip_low,
    const __m256i *clip_high, const __m256i *mask_max) {
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i two_w = _mm256_set1_epi16(2);
  do {
    // Load 8 pixels from each of 8 rows of mask,
    // (saturating) add together rows then use madd to add adjacent pixels
    // Finally, divide each value by 4 (with rounding)
    const __m256i m0246 =
        _mm256_set_epi64x(*(int64_t *)(mask + 6 * mask_stride),
                          *(int64_t *)(mask + 4 * mask_stride),
                          *(int64_t *)(mask + 2 * mask_stride),
                          *(int64_t *)(mask + 0 * mask_stride));
    const __m256i m1357 =
        _mm256_set_epi64x(*(int64_t *)(mask + 7 * mask_stride),
                          *(int64_t *)(mask + 5 * mask_stride),
                          *(int64_t *)(mask + 3 * mask_stride),
                          *(int64_t *)(mask + 1 * mask_stride));
    const __m256i addrows = _mm256_adds_epu8(m0246, m1357);
    const __m256i adjacent = _mm256_maddubs_epi16(addrows, one_b);
    const __m256i mask0 =
        _mm256_srli_epi16(_mm256_add_epi16(adjacent, two_w), 2);

    highbd_blend_a64_d16_mask_w4_avx2(dst, dst_stride, src0, src0_stride, src1,
                                      src1_stride, &mask0, round_offset, shift,
                                      clip_low, clip_high, mask_max);

    dst += dst_stride * 4;
    src0 += src0_stride * 4;
    src1 += src1_stride * 4;
    mask += mask_stride * 8;
  } while (h -= 4);
}